

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall Catch::RunContext::invokeActiveTestCase(RunContext *this)

{
  FatalConditionHandlerGuard local_18;
  FatalConditionHandlerGuard _;
  RunContext *this_local;
  
  _.m_handler = (FatalConditionHandler *)this;
  FatalConditionHandlerGuard::FatalConditionHandlerGuard(&local_18,&this->m_fatalConditionhandler);
  TestCase::invoke(this->m_activeTestCase);
  FatalConditionHandlerGuard::~FatalConditionHandlerGuard(&local_18);
  return;
}

Assistant:

void RunContext::invokeActiveTestCase() {
        FatalConditionHandlerGuard _(&m_fatalConditionhandler);
        m_activeTestCase->invoke();
    }